

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::AddCopy
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  bool bVar1;
  void *copy;
  void *local_28;
  
  local_28 = operator_new((long)size);
  memcpy(local_28,encoded_file_descriptor,(long)size);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->files_to_delete_,&local_28);
  bVar1 = Add(this,local_28,size);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::AddCopy(
    const void* PROTOBUF_NONNULL encoded_file_descriptor, int size) {
  void* copy = operator new(size);
  memcpy(copy, encoded_file_descriptor, size);
  files_to_delete_.push_back(copy);
  return Add(copy, size);
}